

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogLocalResolve(void *catalogs,xmlChar *pubID,xmlChar *sysID)

{
  xmlChar *ret;
  xmlCatalogEntryPtr catal;
  xmlChar *sysID_local;
  xmlChar *pubID_local;
  void *catalogs_local;
  
  if ((pubID == (xmlChar *)0x0) && (sysID == (xmlChar *)0x0)) {
    catalogs_local = (void *)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      if ((pubID == (xmlChar *)0x0) || (sysID == (xmlChar *)0x0)) {
        if (pubID == (xmlChar *)0x0) {
          xmlCatalogPrintDebug("Local Resolve: sysID %s\n",sysID);
        }
        else {
          xmlCatalogPrintDebug("Local Resolve: pubID %s\n",pubID);
        }
      }
      else {
        xmlCatalogPrintDebug("Local Resolve: pubID %s sysID %s\n",pubID,sysID);
      }
    }
    if (catalogs == (void *)0x0) {
      catalogs_local = (void *)0x0;
    }
    else {
      catalogs_local = xmlCatalogListXMLResolve((xmlCatalogEntryPtr)catalogs,pubID,sysID);
      if (((xmlChar *)catalogs_local == (xmlChar *)0x0) ||
         ((xmlChar *)catalogs_local == (xmlChar *)0xffffffffffffffff)) {
        catalogs_local = (void *)0x0;
      }
    }
  }
  return (xmlChar *)catalogs_local;
}

Assistant:

xmlChar *
xmlCatalogLocalResolve(void *catalogs, const xmlChar *pubID,
	               const xmlChar *sysID) {
    xmlCatalogEntryPtr catal;
    xmlChar *ret;

    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    if (xmlDebugCatalogs) {
        if ((pubID != NULL) && (sysID != NULL)) {
            xmlCatalogPrintDebug(
                            "Local Resolve: pubID %s sysID %s\n", pubID, sysID);
        } else if (pubID != NULL) {
            xmlCatalogPrintDebug(
                            "Local Resolve: pubID %s\n", pubID);
        } else {
            xmlCatalogPrintDebug(
                            "Local Resolve: sysID %s\n", sysID);
        }
    }

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return(NULL);
    ret = xmlCatalogListXMLResolve(catal, pubID, sysID);
    if ((ret != NULL) && (ret != XML_CATAL_BREAK))
	return(ret);
    return(NULL);
}